

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

int __thiscall CSnapIDPool::NewID(CSnapIDPool *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int64 iVar4;
  long lVar5;
  
  iVar4 = time_get();
  while (((long)this->m_FirstTimed != -1 && (this->m_aIDs[this->m_FirstTimed].m_Timeout < iVar4))) {
    RemoveFirstTimeout(this);
  }
  iVar3 = this->m_FirstFree;
  lVar5 = (long)iVar3;
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                 ,0x5a,(uint)(lVar5 != -1),"id error");
  if (lVar5 != -1) {
    this->m_FirstFree = (int)this->m_aIDs[this->m_FirstFree].m_Next;
    this->m_aIDs[lVar5].m_State = 1;
    uVar1 = this->m_Usage;
    uVar2 = this->m_InUsage;
    this->m_Usage = uVar1 + 1;
    this->m_InUsage = uVar2 + 1;
  }
  return iVar3;
}

Assistant:

int CSnapIDPool::NewID()
{
	int64 Now = time_get();

	// process timed ids
	while(m_FirstTimed != -1 && m_aIDs[m_FirstTimed].m_Timeout < Now)
		RemoveFirstTimeout();

	int ID = m_FirstFree;
	dbg_assert(ID != -1, "id error");
	if(ID == -1)
		return ID;
	m_FirstFree = m_aIDs[m_FirstFree].m_Next;
	m_aIDs[ID].m_State = 1;
	m_Usage++;
	m_InUsage++;
	return ID;
}